

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmUnaryOp(LlvmCompilationContext *ctx,ExprUnaryOp *node)

{
  TypeStruct *valueType;
  LLVMValueRef pLVar1;
  TypeBase *type;
  LLVMValueRef pLVar2;
  
  pLVar1 = CompileLlvm(ctx,node->value);
  pLVar2 = (LLVMValueRef)&placeholderValue;
  switch(*(undefined4 *)&(node->super_ExprBase).field_0x2c) {
  case 1:
    pLVar2 = pLVar1;
    if (pLVar1 == (LLVMValueRef)0x0) goto switchD_00176298_default;
    break;
  case 2:
    ExpressionContext::IsIntegerType(ctx->ctx,node->value->type);
    break;
  case 3:
    break;
  case 4:
    valueType = (TypeStruct *)node->value->type;
    if (valueType == ctx->ctx->typeAutoRef) {
      type = ctx->ctx->typeNullPtr;
    }
    else {
      type = GetStackType(ctx,(TypeBase *)valueType);
    }
    CompileLlvmType(ctx,type);
    CompileLlvmType(ctx,ctx->ctx->typeInt);
    break;
  default:
switchD_00176298_default:
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x458,"LLVMValueRef CompileLlvmUnaryOp(LlvmCompilationContext &, ExprUnaryOp *)")
    ;
  }
  pLVar2 = CheckType(ctx,&node->super_ExprBase,pLVar2);
  return pLVar2;
}

Assistant:

LLVMValueRef CompileLlvmUnaryOp(LlvmCompilationContext &ctx, ExprUnaryOp *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);

	LLVMValueRef result = NULL;

	switch(node->op)
	{
	case SYN_UNARY_OP_UNKNOWN:
		break;
	case SYN_UNARY_OP_PLUS:
		result = value;
		break;
	case SYN_UNARY_OP_NEGATE:
		if(ctx.ctx.IsIntegerType(node->value->type))
			result = LLVMBuildNeg(ctx.builder, value, "");
		else
			result = LLVMBuildFNeg(ctx.builder, value, "");
		break;
	case SYN_UNARY_OP_BIT_NOT:
		result = LLVMBuildNot(ctx.builder, value, "");
		break;
	case SYN_UNARY_OP_LOGICAL_NOT:
		if(node->value->type == ctx.ctx.typeAutoRef)
		{
			LLVMValueRef ptr = LLVMBuildExtractValue(ctx.builder, value, 1, "ref_ptr");

			LLVMValueRef rhs = LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr));

			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntEQ, ptr, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		}
		else if(isType<TypeRef>(node->value->type))
		{
			LLVMValueRef rhs = LLVMConstPointerNull(CompileLlvmType(ctx, GetStackType(ctx, node->value->type)));

			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntEQ, value, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		}
		else
		{
			LLVMValueRef rhs = LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->value->type)), 0, true);

			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntEQ, value, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		}
		break;
	}

	assert(result);

	return CheckType(ctx, node, result);
}